

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

ostream * covenant::operator<<(ostream *o,vector<covenant::Sym,_std::allocator<covenant::Sym>_> *v)

{
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_RSI;
  ostream *in_RDI;
  uint i;
  uint local_14;
  
  std::operator<<(in_RDI,"[");
  local_14 = 0;
  while( true ) {
    uVar1 = (ulong)local_14;
    sVar2 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(in_RSI);
    if (sVar2 <= uVar1) break;
    poVar3 = in_RDI;
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[](in_RSI,(ulong)local_14);
    poVar3 = operator<<(poVar3,(Sym)(int)(uVar1 >> 0x20));
    std::operator<<(poVar3,";");
    local_14 = local_14 + 1;
  }
  std::operator<<(in_RDI,"]");
  return in_RDI;
}

Assistant:

inline ostream& operator<<(ostream& o, const vector<T> &v) {
    o << "[";
    for (unsigned i=0; i < v.size(); i++)
      o << v[i] << ";" ;
    o << "]";
    return o;
  }